

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void codeReal(Vdbe *v,char *z,int negateFlag,int iMem)

{
  long lVar1;
  size_t sVar2;
  u8 *in_R9;
  long in_FS_OFFSET;
  double value;
  int p4type;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (z != (char *)0x0) {
    p4type = -1;
    sVar2 = strlen(z);
    sqlite3AtoF(z,(double *)&stack0xffffffffffffffc8,(uint)sVar2 & 0x3fffffff,'\x01');
    sqlite3VdbeAddOp4Dup8(v,0x9a,iMem,(int)&stack0xffffffffffffffc8,-0xc,in_R9,p4type);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void codeReal(Vdbe *v, const char *z, int negateFlag, int iMem){
  if( ALWAYS(z!=0) ){
    double value;
    sqlite3AtoF(z, &value, sqlite3Strlen30(z), SQLITE_UTF8);
    assert( !sqlite3IsNaN(value) ); /* The new AtoF never returns NaN */
    if( negateFlag ) value = -value;
    sqlite3VdbeAddOp4Dup8(v, OP_Real, 0, iMem, 0, (u8*)&value, P4_REAL);
  }
}